

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdFreeFundRawTxHandle(void *handle,void *fund_handle)

{
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *pvVar1;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
  *this_01;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if (fund_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"FundRawTxData",&local_39);
    cfd::capi::CheckBuffer(fund_handle,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pvVar1 = *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)fund_handle + 0x38);
    if (pvVar1 != (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0) {
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(pvVar1);
      operator_delete(pvVar1);
      *(undefined8 *)((long)fund_handle + 0x38) = 0;
    }
    pvVar1 = *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)fund_handle + 0x40);
    if (pvVar1 != (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0) {
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(pvVar1);
      operator_delete(pvVar1);
      *(undefined8 *)((long)fund_handle + 0x40) = 0;
    }
    this = *(vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             **)((long)fund_handle + 0x48);
    if (this != (vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                 *)0x0) {
      std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
      ::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)fund_handle + 0x48) = 0;
    }
    this_00 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                **)((long)fund_handle + 0x50);
    if (this_00 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      operator_delete(this_00);
      *(undefined8 *)((long)fund_handle + 0x50) = 0;
    }
    this_01 = *(vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                **)((long)fund_handle + 0x58);
    if (this_01 !=
        (vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
         *)0x0) {
      std::
      vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
      ::~vector(this_01);
      operator_delete(this_01);
      *(undefined8 *)((long)fund_handle + 0x58) = 0;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"FundRawTxData",&local_39);
  cfd::capi::FreeBuffer(fund_handle,&local_38,0x90);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeFundRawTxHandle(void* handle, void* fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (fund_handle != nullptr) {
      CheckBuffer(fund_handle, kPrefixFundRawTxData);
      CfdCapiFundRawTxData* fund_struct =
          static_cast<CfdCapiFundRawTxData*>(fund_handle);
      if (fund_struct->utxos != nullptr) {
        delete fund_struct->utxos;
        fund_struct->utxos = nullptr;
      }
      if (fund_struct->input_utxos != nullptr) {
        delete fund_struct->input_utxos;
        fund_struct->input_utxos = nullptr;
      }
#ifndef CFD_DISABLE_ELEMENTS
      if (fund_struct->input_elements_utxos != nullptr) {
        delete fund_struct->input_elements_utxos;
        fund_struct->input_elements_utxos = nullptr;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (fund_struct->append_txout_addresses != nullptr) {
        delete fund_struct->append_txout_addresses;
        fund_struct->append_txout_addresses = nullptr;
      }
      if (fund_struct->targets != nullptr) {
        delete fund_struct->targets;
        fund_struct->targets = nullptr;
      }
    }
    FreeBuffer(
        fund_handle, kPrefixFundRawTxData, sizeof(CfdCapiFundRawTxData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}